

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O1

void __thiscall MarkdownHighlighter::iniHighlighter(MarkdownHighlighter *this,QString *text)

{
  char16_t cVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  QTextFormat *pQVar6;
  CaseSensitivity CVar7;
  int iVar8;
  wchar32 wVar9;
  QChar QVar10;
  int iVar12;
  long lVar13;
  QTextCharFormat format;
  anon_union_24_3_e3d07ef4_for_data local_70;
  QTextFormat local_50 [16];
  QColor local_40;
  UnderlineStyle UVar11;
  
  lVar2 = (text->d).size;
  if (0 < lVar2) {
    lVar13 = 0;
    iVar8 = 0;
    do {
      cVar1 = (text->d).ptr[lVar13];
      iVar12 = (int)lVar2;
      CVar7 = (CaseSensitivity)lVar13;
      QVar10.ucs = (char16_t)text;
      UVar11 = (UnderlineStyle)local_50;
      iVar5 = (int)this;
      if (cVar1 == L'[') {
        local_70._0_4_ = 0x3eb;
        pQVar6 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                            (&_formats,(HighlighterState *)local_70.data)->super_QTextFormat;
        QTextFormat::QTextFormat(local_50,pQVar6);
        iVar4 = QString::indexOf(QVar10,0x5d,CVar7);
        if (iVar4 == -1) {
          QTextCharFormat::setUnderlineStyle(UVar11);
          QColor::QColor(&local_40,red);
          QColor::operator_cast_to_QVariant((QVariant *)&local_70,&local_40);
          QTextFormat::setProperty(UVar11,(QVariant *)0x2020);
          QVariant::~QVariant((QVariant *)&local_70);
          iVar4 = iVar12;
        }
        iVar4 = iVar4 + 1;
        QSyntaxHighlighter::setFormat(iVar5,iVar8,(QTextCharFormat *)(ulong)(uint)(iVar4 - iVar8));
LAB_00124dc9:
        QTextFormat::~QTextFormat(local_50);
        iVar8 = iVar4;
        if (lVar2 <= iVar4) {
          return;
        }
      }
      else {
        if (cVar1 == L';') {
          local_70._0_4_ = 0x3ea;
          QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                    (&_formats,(HighlighterState *)local_70.data);
          QSyntaxHighlighter::setFormat
                    (iVar5,iVar8,(QTextCharFormat *)(ulong)(uint)(iVar12 - iVar8));
          return;
        }
        if (((ushort)cVar1 - 0x41 < 0x3a && (ushort)cVar1 - 0x61 < 0xfffffffa) ||
           ((wVar9 = (wchar32)(ushort)cVar1, 0x7f < (uint)wVar9 &&
            (cVar3 = QChar::isLetter_helper(wVar9), cVar3 != '\0')))) {
          local_70._0_4_ = 1000;
          pQVar6 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                              (&_formats,(HighlighterState *)local_70.data)->super_QTextFormat;
          QTextFormat::QTextFormat(local_50,pQVar6);
          iVar4 = QString::indexOf(QVar10,0x3d,CVar7);
          if (iVar4 == -1) {
            QColor::QColor(&local_40,red);
            QColor::operator_cast_to_QVariant((QVariant *)&local_70,&local_40);
            QTextFormat::setProperty(UVar11,(QVariant *)0x2020);
            QVariant::~QVariant((QVariant *)&local_70);
            QTextCharFormat::setUnderlineStyle(UVar11);
            iVar4 = iVar12;
          }
          QSyntaxHighlighter::setFormat(iVar5,iVar8,(QTextCharFormat *)(ulong)(uint)(iVar4 - iVar8))
          ;
          iVar4 = iVar4 + -1;
          goto LAB_00124dc9;
        }
        if (wVar9 == L'=') {
          iVar5 = QString::indexOf(QVar10,0x3b,CVar7);
          iVar8 = iVar5 + -1;
          if (iVar5 == -1) {
            return;
          }
        }
      }
      iVar8 = iVar8 + 1;
      lVar13 = (long)iVar8;
    } while (lVar13 < lVar2);
  }
  return;
}

Assistant:

void MarkdownHighlighter::iniHighlighter(const QString &text) {
    if (text.isEmpty()) return;
    const auto textLen = text.length();

    for (int i = 0; i < textLen; ++i) {
        // start of a [section]
        if (text.at(i) == QChar('[')) {
            QTextCharFormat sectionFormat = _formats[CodeType];
            int sectionEnd = text.indexOf(QChar(']'), i);
            // if an end bracket isn't found, we apply red underline to show
            // error
            if (sectionEnd == -1) {
                sectionFormat.setUnderlineStyle(QTextCharFormat::DotLine);
                sectionFormat.setUnderlineColor(Qt::red);
                sectionEnd = textLen;
            }
            sectionEnd++;
            setFormat(i, sectionEnd - i, sectionFormat);
            i = sectionEnd;
            if (i >= textLen) break;
        }

        // comment ';'
        else if (text.at(i) == QChar(';')) {
            setFormat(i, textLen - i, _formats[CodeComment]);
            i = textLen;
            break;
        }

        // key-val
        else if (text.at(i).isLetter()) {
            QTextCharFormat format = _formats[CodeKeyWord];
            int equalsPos = text.indexOf(QChar('='), i);
            if (equalsPos == -1) {
                format.setUnderlineColor(Qt::red);
                format.setUnderlineStyle(QTextCharFormat::DotLine);
                equalsPos = textLen;
            }
            setFormat(i, equalsPos - i, format);
            i = equalsPos - 1;
            if (i >= textLen) break;
        }
        // skip everything after '=' (except comment)
        else if (text.at(i) == QChar('=')) {
            const int findComment = text.indexOf(QChar(';'), i);
            if (findComment == -1) break;
            i = findComment - 1;
        }
    }
}